

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void upb_Decoder_AddUnknownMessageSetItem
               (upb_Decoder *d,upb_Message *msg,uint32_t type_id,char *message_data,
               uint32_t message_size)

{
  _Bool _Var1;
  char *pcVar2;
  char *pcVar3;
  undefined1 local_a8 [8];
  upb_StringView unknown [3];
  char *end;
  char *split;
  char *ptr;
  char buf [30];
  uint32_t message_size_local;
  char *message_data_local;
  uint32_t type_id_local;
  upb_Message *msg_local;
  upb_Decoder *d_local;
  
  pcVar2 = upb_Decoder_EncodeVarint32(0xb,(char *)&ptr);
  pcVar2 = upb_Decoder_EncodeVarint32(0x10,pcVar2);
  pcVar2 = upb_Decoder_EncodeVarint32(type_id,pcVar2);
  pcVar2 = upb_Decoder_EncodeVarint32(0x1a,pcVar2);
  pcVar2 = upb_Decoder_EncodeVarint32(message_size,pcVar2);
  pcVar3 = upb_Decoder_EncodeVarint32(0xc,pcVar2);
  local_a8 = (undefined1  [8])&ptr;
  unknown[0].data = pcVar2 + -(long)&ptr;
  unknown[1].data = (char *)(ulong)message_size;
  unknown[2].data = pcVar3 + -(long)pcVar2;
  unknown[0].size = (size_t)message_data;
  unknown[1].size = (size_t)pcVar2;
  _Var1 = _upb_Message_AddUnknownV_dont_copy_me__upb_internal_use_only
                    (msg,&(d->field_7).arena,(upb_StringView *)local_a8,3);
  if (!_Var1) {
    _upb_Decoder_ErrorJmp(d,kUpb_DecodeStatus_OutOfMemory);
  }
  return;
}

Assistant:

static void upb_Decoder_AddUnknownMessageSetItem(upb_Decoder* d,
                                                 upb_Message* msg,
                                                 uint32_t type_id,
                                                 const char* message_data,
                                                 uint32_t message_size) {
  char buf[6 * kUpb_Decoder_EncodeVarint32MaxSize];
  char* ptr = buf;
  ptr = upb_Decoder_EncodeVarint32(kStartItemTag, ptr);
  ptr = upb_Decoder_EncodeVarint32(kTypeIdTag, ptr);
  ptr = upb_Decoder_EncodeVarint32(type_id, ptr);
  ptr = upb_Decoder_EncodeVarint32(kMessageTag, ptr);
  ptr = upb_Decoder_EncodeVarint32(message_size, ptr);
  char* split = ptr;

  ptr = upb_Decoder_EncodeVarint32(kEndItemTag, ptr);
  char* end = ptr;
  upb_StringView unknown[] = {
      {buf, split - buf},
      {message_data, message_size},
      {split, end - split},
  };
  if (!UPB_PRIVATE(_upb_Message_AddUnknownV)(msg, &d->arena, unknown, 3)) {
    _upb_Decoder_ErrorJmp(d, kUpb_DecodeStatus_OutOfMemory);
  }
}